

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O2

void I_GetAxes(float *axes)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    axes[lVar1] = 0.0;
  }
  if (use_joystick.Value != false) {
    SDLInputJoystickManager::AddAxes(JoystickManager,axes);
    return;
  }
  return;
}

Assistant:

void I_GetAxes(float axes[NUM_JOYAXIS])
{
	for (int i = 0; i < NUM_JOYAXIS; ++i)
	{
		axes[i] = 0;
	}
	if (use_joystick)
	{
		JoystickManager->AddAxes(axes);
	}
}